

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# taskflow.hpp
# Opt level: O0

void __thiscall tf::Taskflow::_dump(Taskflow *this,ostream *os,Graph *top)

{
  mapped_type mVar1;
  bool bVar2;
  mapped_type *pmVar3;
  reference pvVar4;
  type *ppNVar5;
  type *ppGVar6;
  ostream *poVar7;
  ulong uVar8;
  ostream *in_RSI;
  void *in_RDI;
  type *f;
  type *p;
  Dumper dumper;
  value_type *in_stack_fffffffffffffea8;
  Dumper *in_stack_fffffffffffffeb0;
  Node *dumper_00;
  Graph *graph;
  ostream *in_stack_ffffffffffffff28;
  Taskflow *in_stack_ffffffffffffff30;
  void *local_c0;
  pair<const_tf::Node_*,_const_tf::Graph_*> local_b8;
  mapped_type local_a8;
  Graph *local_18;
  ostream *local_10;
  
  local_10 = in_RSI;
  Dumper::Dumper(in_stack_fffffffffffffeb0);
  local_a8 = 0;
  local_c0 = (void *)0x0;
  std::pair<const_tf::Node_*,_const_tf::Graph_*>::pair<std::nullptr_t,_const_tf::Graph_*&,_true>
            (&local_b8,&local_c0,&local_18);
  std::
  stack<std::pair<const_tf::Node_*,_const_tf::Graph_*>,_std::deque<std::pair<const_tf::Node_*,_const_tf::Graph_*>,_std::allocator<std::pair<const_tf::Node_*,_const_tf::Graph_*>_>_>_>
  ::push((stack<std::pair<const_tf::Node_*,_const_tf::Graph_*>,_std::deque<std::pair<const_tf::Node_*,_const_tf::Graph_*>,_std::allocator<std::pair<const_tf::Node_*,_const_tf::Graph_*>_>_>_>
          *)in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  mVar1 = local_a8;
  local_a8 = local_a8 + 1;
  pmVar3 = std::
           unordered_map<const_tf::Graph_*,_unsigned_long,_std::hash<const_tf::Graph_*>,_std::equal_to<const_tf::Graph_*>,_std::allocator<std::pair<const_tf::Graph_*const,_unsigned_long>_>_>
           ::operator[]((unordered_map<const_tf::Graph_*,_unsigned_long,_std::hash<const_tf::Graph_*>,_std::equal_to<const_tf::Graph_*>,_std::allocator<std::pair<const_tf::Graph_*const,_unsigned_long>_>_>
                         *)in_stack_fffffffffffffeb0,(key_type *)in_stack_fffffffffffffea8);
  *pmVar3 = mVar1;
  while (bVar2 = std::
                 stack<std::pair<const_tf::Node_*,_const_tf::Graph_*>,_std::deque<std::pair<const_tf::Node_*,_const_tf::Graph_*>,_std::allocator<std::pair<const_tf::Node_*,_const_tf::Graph_*>_>_>_>
                 ::empty((stack<std::pair<const_tf::Node_*,_const_tf::Graph_*>,_std::deque<std::pair<const_tf::Node_*,_const_tf::Graph_*>,_std::allocator<std::pair<const_tf::Node_*,_const_tf::Graph_*>_>_>_>
                          *)0x12f30f), ((bVar2 ^ 0xffU) & 1) != 0) {
    pvVar4 = std::
             stack<std::pair<const_tf::Node_*,_const_tf::Graph_*>,_std::deque<std::pair<const_tf::Node_*,_const_tf::Graph_*>,_std::allocator<std::pair<const_tf::Node_*,_const_tf::Graph_*>_>_>_>
             ::top((stack<std::pair<const_tf::Node_*,_const_tf::Graph_*>,_std::deque<std::pair<const_tf::Node_*,_const_tf::Graph_*>,_std::allocator<std::pair<const_tf::Node_*,_const_tf::Graph_*>_>_>_>
                    *)0x12f331);
    dumper_00 = pvVar4->first;
    graph = pvVar4->second;
    ppNVar5 = std::get<0ul,tf::Node_const*,tf::Graph_const*>
                        ((pair<const_tf::Node_*,_const_tf::Graph_*> *)0x12f354);
    ppGVar6 = std::get<1ul,tf::Node_const*,tf::Graph_const*>
                        ((pair<const_tf::Node_*,_const_tf::Graph_*> *)0x12f363);
    std::
    stack<std::pair<const_tf::Node_*,_const_tf::Graph_*>,_std::deque<std::pair<const_tf::Node_*,_const_tf::Graph_*>,_std::allocator<std::pair<const_tf::Node_*,_const_tf::Graph_*>_>_>_>
    ::pop((stack<std::pair<const_tf::Node_*,_const_tf::Graph_*>,_std::deque<std::pair<const_tf::Node_*,_const_tf::Graph_*>,_std::allocator<std::pair<const_tf::Node_*,_const_tf::Graph_*>_>_>_>
           *)0x12f375);
    poVar7 = std::operator<<(local_10,"subgraph cluster_p");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,*ppGVar6);
    std::operator<<(poVar7," {\nlabel=\"");
    if (*ppNVar5 == (type)0x0) {
      std::operator<<(local_10,"Taskflow: ");
      uVar8 = std::__cxx11::string::empty();
      if ((uVar8 & 1) == 0) {
        std::operator<<(local_10,(string *)((long)in_RDI + 0x30));
      }
      else {
        in_stack_fffffffffffffea8 = (value_type *)std::operator<<(local_10,'p');
        std::ostream::operator<<(in_stack_fffffffffffffea8,in_RDI);
      }
    }
    else {
      poVar7 = std::operator<<(local_10,'m');
      in_stack_fffffffffffffeb0 =
           (Dumper *)
           std::
           unordered_map<const_tf::Graph_*,_unsigned_long,_std::hash<const_tf::Graph_*>,_std::equal_to<const_tf::Graph_*>,_std::allocator<std::pair<const_tf::Graph_*const,_unsigned_long>_>_>
           ::operator[]((unordered_map<const_tf::Graph_*,_unsigned_long,_std::hash<const_tf::Graph_*>,_std::equal_to<const_tf::Graph_*>,_std::allocator<std::pair<const_tf::Graph_*const,_unsigned_long>_>_>
                         *)in_stack_fffffffffffffeb0,(key_type *)in_stack_fffffffffffffea8);
      std::ostream::operator<<(poVar7,in_stack_fffffffffffffeb0->id);
    }
    std::operator<<(local_10,"\";\n");
    _dump(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,graph,(Dumper *)dumper_00);
    std::operator<<(local_10,"}\n");
  }
  Dumper::~Dumper(in_stack_fffffffffffffeb0);
  return;
}

Assistant:

inline void Taskflow::_dump(std::ostream& os, const Graph* top) const {

  Dumper dumper;

  dumper.id = 0;
  dumper.stack.push({nullptr, top});
  dumper.visited[top] = dumper.id++;

  while(!dumper.stack.empty()) {

    auto [p, f] = dumper.stack.top();
    dumper.stack.pop();

    os << "subgraph cluster_p" << f << " {\nlabel=\"";

    // n-level module
    if(p) {
      os << 'm' << dumper.visited[f];
    }
    // top-level taskflow graph
    else {
      os << "Taskflow: ";
      if(_name.empty()) os << 'p' << this;
      else os << _name;
    }

    os << "\";\n";

    _dump(os, f, dumper);
    os << "}\n";
  }
}